

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O1

long duckdb::BitwiseShiftLeftOperator::Operation<long,long,long>(long input,long shift)

{
  OutOfRangeException *pOVar1;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (input < 0) {
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Cannot left-shift negative number %s","");
    NumericHelper::ToString<long>(&local_48,input);
    OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar1,&local_e8,&local_48);
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (-1 < shift) {
    if (shift < 0x40) {
      if (shift != 0) {
        if ((long)(0x8000000000000000U >> ((byte)shift & 0x3f)) <= input) {
          pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,"Overflow in left shift (%s << %s)","");
          NumericHelper::ToString<long>(&local_a8,input);
          NumericHelper::ToString<long>(&local_c8,shift);
          OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                    (pOVar1,&local_e8,&local_a8,&local_c8);
          __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
        }
        input = input << ((byte)shift & 0x3f);
      }
    }
    else {
      if (input != 0) {
        pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"Left-shift value %s is out of range","");
        NumericHelper::ToString<long>(&local_88,shift);
        OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar1,&local_e8,&local_88);
        __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
      }
      input = 0;
    }
    return input;
  }
  pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"Cannot left-shift by negative number %s","");
  NumericHelper::ToString<long>(&local_68,shift);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar1,&local_e8,&local_68);
  __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input, TB shift) {
		TA max_shift = TA(sizeof(TA) * 8) + (NumericLimits<TA>::IsSigned() ? 0 : 1);
		if (input < 0) {
			throw OutOfRangeException("Cannot left-shift negative number %s", NumericHelper::ToString(input));
		}
		if (shift < 0) {
			throw OutOfRangeException("Cannot left-shift by negative number %s", NumericHelper::ToString(shift));
		}
		if (shift >= max_shift) {
			if (input == 0) {
				return 0;
			}
			throw OutOfRangeException("Left-shift value %s is out of range", NumericHelper::ToString(shift));
		}
		if (shift == 0) {
			return input;
		}
		TA max_value = UnsafeNumericCast<TA>((TA(1) << (max_shift - shift - 1)));
		if (input >= max_value) {
			throw OutOfRangeException("Overflow in left shift (%s << %s)", NumericHelper::ToString(input),
			                          NumericHelper::ToString(shift));
		}
		return UnsafeNumericCast<TR>(input << shift);
	}